

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapl-configure.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint32_t die;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  char *pcVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  raplcap_limit ls;
  raplcap_limit ll;
  double local_140;
  double local_138;
  raplcap_zone local_12c;
  double local_128;
  uint32_t local_11c;
  rapl_configure_ctx local_118;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  double local_90;
  int local_88;
  uint32_t local_84;
  double local_80;
  double local_78;
  double local_70;
  raplcap_limit local_68;
  raplcap_limit local_58;
  raplcap_limit local_48;
  
  local_118.set_constraint = 0;
  local_118._84_4_ = 0;
  local_118.limit_constraint.seconds = 0.0;
  local_118.limit_short.seconds = 0.0;
  local_118.limit_short.watts = 0.0;
  local_118.limit_long.watts = 0.0;
  local_118.set_short = 0;
  local_118._60_4_ = 0;
  uVar7 = local_118._56_8_;
  local_118.set_long = 0;
  local_118._36_4_ = 0;
  uVar6 = local_118._32_8_;
  local_118.limit_long.seconds = 0.0;
  local_118.pkg = 0;
  local_118.die = 0;
  local_118.enabled = 0;
  local_118.set_enabled = 0;
  local_118.get_packages = 0;
  local_118.get_die = 0;
  local_118.zone = RAPLCAP_ZONE_PACKAGE;
  local_118.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
  local_118.limit_constraint.watts = 0.0;
  prog = *argv;
  local_118.set_short = 0;
  local_138 = 0.0;
  local_140 = 0.0;
  local_118.set_long = 0;
  local_128 = 0.0;
  local_a0 = 0;
  iVar16 = 0;
  local_78 = 0.0;
  local_70 = 0.0;
  local_12c = RAPLCAP_ZONE_PACKAGE;
  local_84 = 0;
  local_98 = (double)((ulong)local_98 & 0xffffffff00000000);
  local_a8 = (double)((ulong)local_a8 & 0xffffffff00000000);
  local_90 = (double)((ulong)local_90 & 0xffffffff00000000);
  local_88 = 0;
  local_11c = 0;
  local_80 = (double)((ulong)local_80 & 0xffffffff00000000);
  iVar15 = local_118.set_short;
  iVar12 = local_118.set_long;
  iVar13 = 0;
  local_118._32_8_ = uVar6;
  local_118._56_8_ = uVar7;
switchD_00103132_caseD_6e:
  while( true ) {
    iVar18 = iVar13;
    iVar10 = iVar12;
    iVar17 = iVar15;
    iVar11 = getopt_long(argc,argv,"nNc:d:z:l:t:p:e:s:w:S:W:C:Lh",long_options,0);
    pcVar20 = _optarg;
    iVar15 = iVar17;
    iVar12 = iVar10;
    if (0x56 < iVar11) goto code_r0x0010311a;
    if (iVar11 != 0x4e) break;
    local_118.get_die = 1;
    local_80 = (double)CONCAT44(local_80._4_4_,1);
    iVar13 = iVar18;
  }
  if (iVar11 == 0x53) {
    dVar1 = atof(_optarg);
    local_138 = dVar1;
    goto LAB_001031c2;
  }
  if (iVar11 == -1) {
    local_118.set_short = iVar17;
    local_118.limit_short.seconds = local_138;
    local_118.limit_long.watts = local_140;
    local_118.set_long = iVar10;
    local_118.limit_long.seconds = local_128;
    local_118.enabled = iVar16;
    local_118.limit_short.watts = local_70;
    local_118.get_packages = iVar18;
    if (iVar18 != 0) {
      uVar14 = raplcap_get_num_packages((raplcap *)0x0);
      if (uVar14 != 0) {
LAB_001034f7:
        printf("%u\n",(ulong)uVar14);
        return 0;
      }
      pcVar20 = "Failed to get number of packages";
LAB_00103887:
      perror(pcVar20);
      return 1;
    }
    if (local_80._0_4_ != 0) {
      uVar14 = raplcap_get_num_die((raplcap *)0x0,local_11c);
      if (uVar14 != 0) goto LAB_001034f7;
      pcVar20 = "Failed to get number of die";
      goto LAB_00103887;
    }
    iVar16 = local_a8._0_4_;
    bVar4 = local_88 == 0;
    bVar5 = local_90._0_4_ == 0;
    bVar3 = local_a8._0_4_ == 0;
    bVar2 = local_98._0_4_ == 0;
    if (((bVar4 && bVar5) && bVar3) && bVar2) {
      setenv("RAPLCAP_READ_ONLY","1",0);
    }
    iVar15 = raplcap_init((raplcap *)0x0);
    die = local_84;
    if (iVar15 != 0) {
      pcVar20 = "Failed to initialize";
      goto LAB_00103887;
    }
    iVar15 = raplcap_pd_is_zone_supported((raplcap *)0x0,local_11c,local_84,local_12c);
    if (iVar15 < 0) {
      main_cold_2();
LAB_00103593:
      if (((bVar4 && bVar5) && bVar3) && bVar2) {
        local_58.seconds = 0.0;
        local_58.watts = 0.0;
        local_68.seconds = 0.0;
        local_68.watts = 0.0;
        local_48.seconds = 0.0;
        local_48.watts = 0.0;
        iVar15 = raplcap_pd_is_zone_enabled((raplcap *)0x0,local_11c,die,local_12c);
        if (iVar15 < 0) {
          main_cold_8();
        }
        iVar16 = raplcap_pd_get_limits((raplcap *)0x0,local_11c,die,local_12c,&local_58,&local_68);
        if (iVar16 == 0) {
          iVar16 = raplcap_pd_is_constraint_supported
                             ((raplcap *)0x0,local_11c,die,local_12c,RAPLCAP_CONSTRAINT_PEAK_POWER);
          if (iVar16 < 0) {
            main_cold_9();
          }
          else if ((iVar16 != 0) &&
                  (iVar16 = raplcap_pd_get_limit
                                      ((raplcap *)0x0,local_11c,die,local_12c,
                                       RAPLCAP_CONSTRAINT_PEAK_POWER,&local_48), iVar16 != 0)) {
            pcVar20 = "Failed to get peak power limit";
            goto LAB_001038f4;
          }
          local_98 = raplcap_pd_get_energy_counter((raplcap *)0x0,local_11c,die,local_12c);
          local_90 = raplcap_pd_get_energy_counter_max((raplcap *)0x0,local_11c,die,local_12c);
          dVar9 = local_48.watts;
          dVar8 = local_58.watts;
          dVar1 = local_68.watts;
          local_80 = local_58.seconds;
          local_a8 = local_68.seconds;
          pcVar20 = "true";
          if (iVar15 == 0) {
            pcVar20 = "false";
          }
          pcVar19 = "unknown";
          if (-1 < iVar15) {
            pcVar19 = pcVar20;
          }
          printf("%13s: %s\n","enabled",pcVar19);
          printf("%13s: %.12f\n",SUB84(dVar8,0),"watts_long");
          printf("%13s: %.12f\n",SUB84(local_80,0),"seconds_long");
          if (0.0 < local_a8) {
            printf("%13s: %.12f\n",SUB84(dVar1,0),"watts_short");
            printf("%13s: %.12f\n",SUB84(local_a8,0),"seconds_short");
          }
          if (0.0 < dVar9) {
            printf("%13s: %.12f\n","watts_peak");
          }
          if (0.0 <= local_98) {
            printf("%13s: %.12f\n","joules");
          }
          iVar16 = 0;
          if (0.0 <= local_90) {
            printf("%13s: %.12f\n","joules_max");
          }
        }
        else {
          pcVar20 = "Failed to get limits";
LAB_001038f4:
          perror(pcVar20);
        }
        goto LAB_00103906;
      }
      iVar15 = raplcap_pd_is_constraint_supported
                         ((raplcap *)0x0,local_11c,die,local_12c,(raplcap_constraint)local_a0);
      if (iVar15 < 0) {
        main_cold_4();
      }
      else if (iVar15 == 0) {
        main_cold_3();
        goto LAB_00103900;
      }
      if (((int)local_a0 != 2) || (local_78 <= 0.0)) {
        if (iVar16 != 0) {
          iVar16 = raplcap_pd_is_constraint_supported
                             ((raplcap *)0x0,local_11c,die,local_12c,RAPLCAP_CONSTRAINT_SHORT_TERM);
          if (iVar16 < 0) {
            main_cold_6();
          }
          else if (iVar16 == 0) {
            main_cold_5();
            goto LAB_00103900;
          }
        }
        iVar16 = configure_limits(&local_118);
        goto LAB_00103906;
      }
      main_cold_7();
    }
    else {
      if (iVar15 != 0) goto LAB_00103593;
      main_cold_1();
    }
LAB_00103900:
    iVar16 = -1;
LAB_00103906:
    iVar15 = raplcap_destroy((raplcap *)0x0);
    if (iVar15 == 0) {
      return iVar16;
    }
    perror("Failed to clean up");
    return iVar16;
  }
  goto switchD_00103132_caseD_66;
code_r0x0010311a:
  iVar13 = 1;
  switch(iVar11) {
  case 99:
    local_11c = atoi(_optarg);
    iVar13 = iVar18;
    local_118.pkg = local_11c;
    goto switchD_00103132_caseD_6e;
  case 100:
    local_84 = atoi(_optarg);
    iVar13 = iVar18;
    local_118.die = local_84;
    goto switchD_00103132_caseD_6e;
  case 0x65:
    iVar16 = atoi(_optarg);
    local_118.set_enabled = 1;
    local_88 = 1;
    iVar13 = iVar18;
    goto switchD_00103132_caseD_6e;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x79:
    goto switchD_00103132_caseD_66;
  case 0x68:
    local_118.set_short = iVar17;
    local_118.limit_short.seconds = local_138;
    local_118.limit_long.watts = local_140;
    local_118.set_long = iVar10;
    local_118.limit_long.seconds = local_128;
    local_118.enabled = iVar16;
    print_usage(0);
  case 0x6c:
    iVar13 = strcmp(_optarg,"LONG");
    if (iVar13 == 0) {
      local_118.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
      local_a0 = 0;
      iVar13 = iVar18;
    }
    else {
      iVar13 = strcmp(pcVar20,"SHORT");
      if (iVar13 == 0) {
        local_118.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
        local_a0 = 1;
        iVar13 = iVar18;
      }
      else {
        iVar13 = strcmp(pcVar20,"PEAK");
        if (iVar13 != 0) goto switchD_00103132_caseD_66;
        local_118.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
        local_a0 = 2;
        iVar13 = iVar18;
      }
    }
  case 0x6e:
    goto switchD_00103132_caseD_6e;
  case 0x70:
    local_118.limit_constraint.watts = atof(_optarg);
    uVar21 = SUB84(local_118.limit_constraint.watts,0);
    uVar22 = (undefined4)((ulong)local_118.limit_constraint.watts >> 0x20);
    break;
  case 0x73:
    local_128 = atof(_optarg);
    uVar21 = SUB84(local_128,0);
    uVar22 = (undefined4)((ulong)local_128 >> 0x20);
    goto LAB_00103267;
  case 0x74:
    local_118.limit_constraint.seconds = atof(_optarg);
    uVar21 = SUB84(local_118.limit_constraint.seconds,0);
    uVar22 = (undefined4)((ulong)local_118.limit_constraint.seconds >> 0x20);
    local_78 = local_118.limit_constraint.seconds;
    break;
  case 0x77:
    local_140 = atof(_optarg);
    uVar21 = SUB84(local_140,0);
    uVar22 = (undefined4)((ulong)local_140 >> 0x20);
LAB_00103267:
    dVar1 = (double)CONCAT44(uVar22,uVar21);
    iVar12 = 1;
    local_90 = (double)CONCAT44(local_90._4_4_,1);
LAB_00103281:
    iVar13 = iVar18;
    if (0.0 < dVar1) goto switchD_00103132_caseD_6e;
    goto LAB_00103926;
  case 0x7a:
    iVar13 = strcmp(_optarg,"PACKAGE");
    if (iVar13 == 0) {
      local_118.zone = RAPLCAP_ZONE_PACKAGE;
      local_12c = RAPLCAP_ZONE_PACKAGE;
      iVar13 = iVar18;
    }
    else {
      iVar13 = strcmp(pcVar20,"CORE");
      if (iVar13 == 0) {
        local_118.zone = RAPLCAP_ZONE_CORE;
        local_12c = RAPLCAP_ZONE_CORE;
        iVar13 = iVar18;
      }
      else {
        iVar13 = strcmp(pcVar20,"UNCORE");
        if (iVar13 == 0) {
          local_118.zone = RAPLCAP_ZONE_UNCORE;
          local_12c = RAPLCAP_ZONE_UNCORE;
          iVar13 = iVar18;
        }
        else {
          iVar13 = strcmp(pcVar20,"DRAM");
          if (iVar13 == 0) {
            local_118.zone = RAPLCAP_ZONE_DRAM;
            local_12c = RAPLCAP_ZONE_DRAM;
            iVar13 = iVar18;
          }
          else {
            iVar13 = strcmp(pcVar20,"PSYS");
            if (iVar13 != 0) goto switchD_00103132_caseD_66;
            local_118.zone = RAPLCAP_ZONE_PSYS;
            local_12c = RAPLCAP_ZONE_PSYS;
            iVar13 = iVar18;
          }
        }
      }
    }
    goto switchD_00103132_caseD_6e;
  default:
    if (iVar11 != 0x57) goto switchD_00103132_caseD_66;
    dVar1 = atof(_optarg);
    local_70 = dVar1;
LAB_001031c2:
    local_a8 = (double)CONCAT44(local_a8._4_4_,1);
    iVar15 = 1;
    goto LAB_00103281;
  }
  if (0.0 < (double)CONCAT44(uVar22,uVar21)) {
    local_118.set_constraint = 1;
    local_98 = (double)CONCAT44(local_98._4_4_,1);
    iVar13 = iVar18;
    goto switchD_00103132_caseD_6e;
  }
LAB_00103926:
  local_118.set_short = iVar17;
  local_118.limit_short.seconds = local_138;
  local_118.limit_long.watts = local_140;
  local_118.set_long = iVar10;
  local_118.limit_long.seconds = local_128;
  local_118.enabled = iVar16;
  fwrite("Time window and power limit values must be > 0\n",0x2f,1,_stderr);
  goto LAB_001039b0;
switchD_00103132_caseD_66:
  local_118.set_short = iVar17;
  local_118.limit_short.seconds = local_138;
  local_118.limit_long.watts = local_140;
  local_118.set_long = iVar10;
  local_118.limit_long.seconds = local_128;
  local_118.enabled = iVar16;
LAB_001039b0:
  print_usage(1);
}

Assistant:

int main(int argc, char** argv) {
  rapl_configure_ctx ctx = { 0 };
  int ret = 0;
  int c;
  uint32_t count;
  prog = argv[0];
  int is_read_only;

  // parse parameters
  while ((c = getopt_long(argc, argv, short_options, long_options, NULL)) != -1) {
    switch (c) {
      case 'h':
        print_usage(0);
        break;
      case 'c':
        ctx.pkg = (unsigned int) atoi(optarg);
        break;
      case 'd':
        ctx.die = (unsigned int) atoi(optarg);
        break;
      case 'n':
        ctx.get_packages = 1;
        break;
      case 'N':
        ctx.get_die = 1;
        break;
      case 'z':
        if (!strcmp(optarg, "PACKAGE")) {
          ctx.zone = RAPLCAP_ZONE_PACKAGE;
        } else if (!strcmp(optarg, "CORE")) {
          ctx.zone = RAPLCAP_ZONE_CORE;
        } else if (!strcmp(optarg, "UNCORE")) {
          ctx.zone = RAPLCAP_ZONE_UNCORE;
        } else if (!strcmp(optarg, "DRAM")) {
          ctx.zone = RAPLCAP_ZONE_DRAM;
        } else if (!strcmp(optarg, "PSYS")) {
          ctx.zone = RAPLCAP_ZONE_PSYS;
        } else {
          print_usage(1);
        }
        break;
      case 'l':
        if (!strcmp(optarg, "LONG")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
        } else if (!strcmp(optarg, "SHORT")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
        } else if (!strcmp(optarg, "PEAK")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
        } else {
          print_usage(1);
        }
        break;
      case 't':
        SET_VAL(optarg, ctx.limit_constraint.seconds, ctx.set_constraint);
        break;
      case 'p':
        SET_VAL(optarg, ctx.limit_constraint.watts, ctx.set_constraint);
        break;
      case 'e':
        ctx.enabled = atoi(optarg);
        ctx.set_enabled = 1;
        break;
      case 's':
        SET_VAL(optarg, ctx.limit_long.seconds, ctx.set_long);
        break;
      case 'w':
        SET_VAL(optarg, ctx.limit_long.watts, ctx.set_long);
        break;
      case 'S':
        SET_VAL(optarg, ctx.limit_short.seconds, ctx.set_short);
        break;
      case 'W':
        SET_VAL(optarg, ctx.limit_short.watts, ctx.set_short);
        break;
#ifdef RAPLCAP_msr
      case 'C':
        ctx.clamped = atoi(optarg);
        ctx.set_clamped = 1;
        break;
      case 'L':
        ctx.set_locked = 1;
        break;
#endif // RAPLCAP_msr
      case '?':
      default:
        print_usage(1);
        break;
    }
  }

  // just print the number of packages or die and exit
  // these are often unprivileged operations since we don't need to initialize a raplcap instance
  if (ctx.get_packages) {
    count = raplcap_get_num_packages(NULL);
    if (count == 0) {
      perror("Failed to get number of packages");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }
  if (ctx.get_die) {
    count = raplcap_get_num_die(NULL, ctx.pkg);
    if (count == 0) {
      perror("Failed to get number of die");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }

  // initialize
  is_read_only = !ctx.set_enabled && !ctx.set_long && !ctx.set_short && !ctx.set_constraint;
#ifdef RAPLCAP_msr
  is_read_only &= !ctx.set_clamped && !ctx.set_locked;
#endif // RAPLCAP_msr
#ifndef _WIN32
  if (is_read_only) {
    // request read-only access (not supported by all implementations, therefore not guaranteed)
    setenv(ENV_RAPLCAP_READ_ONLY, "1", 0);
  }
#endif
  if (raplcap_init(NULL)) {
    perror("Failed to initialize");
    return 1;
  }

  if (!(ret = check_zone_supported(&ctx))) {
    // perform requested action
    if (is_read_only) {
      // TODO: Should we limit output by constraint, too?
      ret = get_limits(ctx.pkg, ctx.die, ctx.zone);
    } else if (!(ret = check_constraint_supported(&ctx))) {
      ret = configure_limits(&ctx);
    }
  }

  // cleanup
  if (raplcap_destroy(NULL)) {
    perror("Failed to clean up");
  }

  return ret;
}